

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_end
          (ConsoleReporter *this,CurrentTestCaseStats *st)

{
  uint uVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  
  if (this->tc->m_no_output != false) {
    return;
  }
  if ((this->opt->duration != false) || (1 < (uint)st->failure_flags)) {
    logTestStart(this);
  }
  if (this->opt->duration == true) {
    poVar2 = this->s;
    Color::operator<<(poVar2,None);
    lVar4 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar4 + -0x18) + 8) = 6;
    lVar4 = *(long *)(lVar4 + -0x18);
    *(uint *)(poVar2 + lVar4 + 0x18) = *(uint *)(poVar2 + lVar4 + 0x18) & 0xfffffefb | 4;
    poVar2 = std::ostream::_M_insert<double>(st->seconds);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," s: ",4);
    pcVar5 = this->tc->m_name;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if ((st->failure_flags & 0x10) != 0) {
    poVar2 = this->s;
    Color::operator<<(poVar2,Red);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Test case exceeded time limit of ",0x21);
    lVar4 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar4 + -0x18) + 8) = 6;
    lVar4 = *(long *)(lVar4 + -0x18);
    *(uint *)(poVar2 + lVar4 + 0x18) = *(uint *)(poVar2 + lVar4 + 0x18) & 0xfffffefb | 4;
    poVar2 = std::ostream::_M_insert<double>(this->tc->m_timeout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!\n",2);
  }
  uVar1 = st->failure_flags;
  if ((uVar1 & 0x20) == 0) {
    if ((uVar1 & 0x40) == 0) {
      if ((uVar1 >> 9 & 1) == 0) {
        if ((char)uVar1 < '\0') {
          poVar2 = this->s;
          Color::operator<<(poVar2,Red);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Didn\'t fail exactly ",0x14);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->tc->m_expected_failures);
          pcVar5 = " times so marking it as failed!\n";
          lVar4 = 0x20;
        }
        else {
          if ((uVar1 >> 8 & 1) == 0) goto LAB_00112849;
          poVar2 = this->s;
          Color::operator<<(poVar2,Yellow);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Failed exactly ",0xf);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->tc->m_expected_failures);
          pcVar5 = " times as expected so marking it as not failed!\n";
          lVar4 = 0x30;
        }
      }
      else {
        poVar2 = this->s;
        Color::operator<<(poVar2,Yellow);
        pcVar5 = "Allowed to fail so marking it as not failed\n";
        lVar4 = 0x2c;
      }
    }
    else {
      poVar2 = this->s;
      Color::operator<<(poVar2,Yellow);
      pcVar5 = "Failed as expected so marking it as not failed\n";
      lVar4 = 0x2f;
    }
  }
  else {
    poVar2 = this->s;
    Color::operator<<(poVar2,Red);
    pcVar5 = "Should have failed but didn\'t! Marking it as failed!\n";
    lVar4 = 0x35;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
LAB_00112849:
  if ((st->failure_flags & 8) != 0) {
    poVar2 = this->s;
    Color::operator<<(poVar2,Red);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Aborting - too many failed asserts!\n",0x24);
  }
  Color::operator<<(this->s,None);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            if(tc->m_no_output)
                return;

            // log the preamble of the test case only if there is something
            // else to print - something other than that an assert has failed
            if(opt.duration ||
               (st.failure_flags && st.failure_flags != TestCaseFailureReason::AssertFailure))
                logTestStart();

            if(opt.duration)
                s << Color::None << std::setprecision(6) << std::fixed << st.seconds
                  << " s: " << tc->m_name << "\n";

            if(st.failure_flags & TestCaseFailureReason::Timeout)
                s << Color::Red << "Test case exceeded time limit of " << std::setprecision(6)
                  << std::fixed << tc->m_timeout << "!\n";

            if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedButDidnt) {
                s << Color::Red << "Should have failed but didn't! Marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedAndDid) {
                s << Color::Yellow << "Failed as expected so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::CouldHaveFailedAndDid) {
                s << Color::Yellow << "Allowed to fail so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::DidntFailExactlyNumTimes) {
                s << Color::Red << "Didn't fail exactly " << tc->m_expected_failures
                  << " times so marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::FailedExactlyNumTimes) {
                s << Color::Yellow << "Failed exactly " << tc->m_expected_failures
                  << " times as expected so marking it as not failed!\n";
            }
            if(st.failure_flags & TestCaseFailureReason::TooManyFailedAsserts) {
                s << Color::Red << "Aborting - too many failed asserts!\n";
            }
            s << Color::None; // lgtm [cpp/useless-expression]
        }